

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::CreatePolymorphicDynamicProfileCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *funcBody,ProfileId callSiteId,
          LocalFunctionId functionId,LocalFunctionId oldFunctionId,SourceId sourceId,
          SourceId oldSourceId)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this_00;
  Recycler *pRVar3;
  PolymorphicCallSiteInfo *pPVar4;
  undefined4 *puVar5;
  CallSiteInfo **ppCVar6;
  uint local_6c;
  int i;
  TrackAllocData local_58;
  PolymorphicCallSiteInfo *local_30;
  PolymorphicCallSiteInfo *localPolyCallSiteInfo;
  SourceId sourceId_local;
  LocalFunctionId oldFunctionId_local;
  LocalFunctionId functionId_local;
  ProfileId callSiteId_local;
  FunctionBody *funcBody_local;
  DynamicProfileInfo *this_local;
  
  localPolyCallSiteInfo._0_4_ = sourceId;
  localPolyCallSiteInfo._4_4_ = oldFunctionId;
  sourceId_local = functionId;
  oldFunctionId_local._2_2_ = callSiteId;
  _functionId_local = funcBody;
  funcBody_local = (FunctionBody *)this;
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)funcBody);
  pRVar3 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&PolymorphicCallSiteInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
             ,0x335);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
  pPVar4 = (PolymorphicCallSiteInfo *)new<Memory::Recycler>(0x28,pRVar3,0x744a10);
  PolymorphicCallSiteInfo::PolymorphicCallSiteInfo(pPVar4);
  pPVar4->functionIds[0] = localPolyCallSiteInfo._4_4_;
  pPVar4->functionIds[1] = sourceId_local;
  pPVar4->sourceIds[0] = oldSourceId;
  pPVar4->sourceIds[1] = (SourceId)localPolyCallSiteInfo;
  local_30 = pPVar4;
  pPVar4 = FunctionBody::GetPolymorphicCallSiteInfoHead(_functionId_local);
  Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator=(&local_30->next,pPVar4);
  for (local_6c = 2; local_6c < 4; local_6c = local_6c + 1) {
    local_30->functionIds[(int)local_6c] = 0xfffffffc;
  }
  bVar2 = CCLock::IsLocked((CCLock *)callSiteInfoCS);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x343,"(this->callSiteInfoCS.IsLocked())",
                                "this->callSiteInfoCS.IsLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  pPVar4 = local_30;
  *(ushort *)&(*ppCVar6)[oldFunctionId_local._2_2_].field_0x2 =
       *(ushort *)&(*ppCVar6)[oldFunctionId_local._2_2_].field_0x2 & 0x7fff | 0x8000;
  ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator=
            ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
             &(*ppCVar6)[oldFunctionId_local._2_2_].u.functionData,pPVar4);
  FunctionBody::SetPolymorphicCallSiteInfoHead(_functionId_local,local_30);
  return;
}

Assistant:

void DynamicProfileInfo::CreatePolymorphicDynamicProfileCallSiteInfo(FunctionBody *funcBody, ProfileId callSiteId, Js::LocalFunctionId functionId, Js::LocalFunctionId oldFunctionId, Js::SourceId sourceId, Js::SourceId oldSourceId)
    {
        PolymorphicCallSiteInfo *localPolyCallSiteInfo = RecyclerNewStructZ(funcBody->GetScriptContext()->GetRecycler(), PolymorphicCallSiteInfo);

        Assert(maxPolymorphicInliningSize >= 2);
        localPolyCallSiteInfo->functionIds[0] = oldFunctionId;
        localPolyCallSiteInfo->functionIds[1] = functionId;
        localPolyCallSiteInfo->sourceIds[0] = oldSourceId;
        localPolyCallSiteInfo->sourceIds[1] = sourceId;
        localPolyCallSiteInfo->next = funcBody->GetPolymorphicCallSiteInfoHead();

        for (int i = 2; i < maxPolymorphicInliningSize; i++)
        {
            localPolyCallSiteInfo->functionIds[i] = CallSiteNoInfo;
        }

        Assert(this->callSiteInfoCS.IsLocked());
        callSiteInfo[callSiteId].isPolymorphic = true;
        callSiteInfo[callSiteId].u.polymorphicCallSiteInfo = localPolyCallSiteInfo;
        funcBody->SetPolymorphicCallSiteInfoHead(localPolyCallSiteInfo);
    }